

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::TextureBarrierBasicOutline::verifyTextureData(TextureBarrierBasicOutline *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar2 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  uVar7 = 0;
  bVar8 = false;
  do {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 8))((uint)uVar7 | 0x84c0);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0xaa0))(0xde1,0,0x8d94,0x1405,this->m_actual);
    uVar1 = this->m_width;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        iVar3 = (int)uVar5;
        if ((ulong)this->m_height != 0) {
          uVar6 = 0;
          do {
            if ((iVar3 < 0) || ((int)uVar6 < 0)) {
              texel(unsigned_int*,unsigned_int,unsigned_int)::zero = 0;
            }
            else if (this->m_reference[uVar7][uVar5] != this->m_actual[uVar5]) {
              return bVar8;
            }
            uVar6 = uVar6 + 1;
            uVar5 = (ulong)((int)uVar5 + uVar1);
          } while (this->m_height != uVar6);
        }
        uVar4 = iVar3 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != uVar1);
    }
    bVar8 = 6 < uVar7;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 8);
  return true;
}

Assistant:

bool verifyTextureData()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			gl.activeTexture(GL_TEXTURE0 + i);
			gl.getTexImage(GL_TEXTURE_2D, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, m_actual);

			for (GLuint x = 0; x < m_width; ++x)
				for (GLuint y = 0; y < m_height; ++y)
				{
					if (texel(m_reference[i], x, y) != texel(m_actual, x, y))
					{
						return false;
					}
				}
		}

		return true;
	}